

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O1

string * __thiscall
VCTools::InputParser::getCmdOption(string *__return_storage_ptr__,InputParser *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  string *psVar6;
  
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->tokens).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->tokens).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pbVar1 = (this->tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var5._M_current == pbVar1) || (psVar6 = _Var5._M_current + 1, psVar6 == pbVar1)) {
    if (getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_ == '\0') {
      iVar4 = __cxa_guard_acquire(&getCmdOption(std::__cxx11::string_const&)::
                                   empty_string_abi_cxx11_);
      if (iVar4 != 0) {
        getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_._M_dataplus._M_p =
             (pointer)&getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_,"")
        ;
        __cxa_atexit(std::__cxx11::string::~string,
                     &getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = &getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_;
    psVar3 = &getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = _Var5._M_current + 1;
  }
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar3->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string getCmdOption(const string & option) const {
			vector<string>::const_iterator itr;
			itr = find(this->tokens.begin(), this->tokens.end(), option);
			if (itr != this->tokens.end() && ++itr != this->tokens.end()) {
				return *itr;
			}
			static const string empty_string("");
			return empty_string;
		}